

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsestream.h
# Opt level: O3

float __thiscall embree::ParseStream::getFloat(ParseStream *this)

{
  double dVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (&local_28,
             &this->
              super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  dVar1 = atof(local_28._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  return (float)dVar1;
}

Assistant:

float getFloat() {
      return (float)atof(get().c_str());
    }